

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O3

lua_Number lua_tonumber(lua_State *L,int idx)

{
  TValue TVar1;
  int iVar2;
  TValue in_RAX;
  TValue *pTVar3;
  TValue TVar4;
  TValue tmp;
  TValue local_8;
  
  local_8 = in_RAX;
  pTVar3 = index2adr(L,idx);
  TVar1 = (TValue)pTVar3->n;
  TVar4 = TVar1;
  if ((0xfffffffffffffff2 < (ulong)(TVar1.it64 >> 0x2f)) &&
     (TVar4.u64 = 0, TVar1.it64 >> 0x2f == 0xfffffffffffffffb)) {
    iVar2 = lj_strscan_num((GCstr *)(TVar1.u64 & 0x7fffffffffff),&local_8);
    TVar4.u64 = 0;
    if (iVar2 != 0) {
      TVar4 = local_8;
    }
  }
  return TVar4.n;
}

Assistant:

LUA_API lua_Number lua_tonumber(lua_State *L, int idx)
{
  cTValue *o = index2adr(L, idx);
  TValue tmp;
  if (LJ_LIKELY(tvisnumber(o)))
    return numberVnum(o);
  else if (tvisstr(o) && lj_strscan_num(strV(o), &tmp))
    return numV(&tmp);
  else
    return 0;
}